

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

void set_pit_type(wchar_t depth,wchar_t type)

{
  pit_profile *ppVar1;
  int16_t iVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong local_40;
  
  lVar6 = 0;
  if (z_info->pit_max != 0) {
    local_40 = 0;
    iVar5 = 999;
    lVar6 = 0x20;
    uVar8 = 0;
    do {
      ppVar1 = pit_info;
      if ((type == L'\0') ||
         ((*(long *)(pit_info->flags + lVar6 + -0x38) != 0 &&
          (*(wchar_t *)(pit_info->flags + lVar6 + -0x30) == type)))) {
        iVar2 = Rand_normal(*(int *)(pit_info->flags + lVar6 + -0x2c),10);
        iVar3 = iVar2 - depth;
        iVar7 = -iVar3;
        if (0 < iVar3) {
          iVar7 = iVar3;
        }
        if (iVar7 < iVar5) {
          uVar4 = Rand_div(*(uint32_t *)(ppVar1->flags + lVar6 + -0x28));
          if (uVar4 == 0) {
            local_40 = uVar8;
            iVar5 = iVar7;
          }
          local_40 = local_40 & 0xffffffff;
        }
      }
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x78;
    } while (uVar8 < z_info->pit_max);
    lVar6 = (long)(int)local_40;
  }
  dun->pit_type = pit_info + lVar6;
  return;
}

Assistant:

void set_pit_type(int depth, int type)
{
	int i;
	int pit_idx = 0;

	/* Hack -- set initial distance large */
	int pit_dist = 999;

	for (i = 0; i < z_info->pit_max; i++) {
		int offset, dist;
		struct pit_profile *pit = &pit_info[i];

		/* Skip empty pits or pits of the wrong room type */
		if (type && (!pit->name || pit->room_type != type)) continue;

		offset = Rand_normal(pit->ave, 10);
		dist = ABS(offset - depth);

		if (dist < pit_dist && one_in_(pit->rarity)) {
			/* This pit is the closest so far */
			pit_idx = i;
			pit_dist = dist;
		}
	}

	dun->pit_type = &pit_info[pit_idx];
}